

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::AssemblyContext::recordTypeIdForValue(AssemblyContext *this,uint32_t value,uint32_t type)

{
  spv_result_t sVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_bool>
  pVar2;
  DiagnosticStream local_1f0;
  
  local_1f0._4_4_ = type;
  local_1f0._0_4_ = value;
  pVar2 = std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_int,unsigned_int>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->value_types_);
  sVar1 = SPV_SUCCESS;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    diagnostic(&local_1f0,this,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f0,"Value is being defined a second time",0x24);
    DiagnosticStream::~DiagnosticStream(&local_1f0);
    sVar1 = local_1f0.error_;
  }
  return sVar1;
}

Assistant:

spv_result_t AssemblyContext::recordTypeIdForValue(uint32_t value,
                                                   uint32_t type) {
  bool successfully_inserted = false;
  std::tie(std::ignore, successfully_inserted) =
      value_types_.insert(std::make_pair(value, type));
  if (!successfully_inserted)
    return diagnostic() << "Value is being defined a second time";
  return SPV_SUCCESS;
}